

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_initCStream_advanced
                 (ZSTDMT_CCtx *mtctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_parameters ZVar1;
  size_t sVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  ZSTD_CCtx_params cctxParams;
  ZSTD_CCtx_params in_stack_fffffffffffffeb8;
  undefined1 local_b8 [12];
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  ZSTD_strategy ZStack_9c;
  ZSTD_frameParameters local_98 [9];
  
  ZVar1 = params;
  bVar6 = 0;
  memcpy(local_b8,&mtctx->params,0x90);
  local_b8._4_4_ = params.cParams.windowLog;
  local_b8._8_4_ = params.cParams.chainLog;
  uStack_ac = ZVar1.cParams.hashLog;
  uStack_a8 = ZVar1.cParams.searchLog;
  uStack_a4 = ZVar1.cParams.minMatch;
  uStack_a0 = params.cParams.targetLength;
  ZStack_9c = params.cParams.strategy;
  local_98[0].contentSizeFlag = params.fParams.contentSizeFlag;
  local_98[0].checksumFlag = params.fParams.checksumFlag;
  local_98[0].noDictIDFlag = params.fParams.noDictIDFlag;
  puVar4 = (undefined8 *)local_b8;
  puVar5 = (undefined8 *)&stack0xfffffffffffffeb8;
  for (lVar3 = 0x12; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  sVar2 = ZSTDMT_initCStream_internal
                    (mtctx,dict,dictSize,ZSTD_dct_auto,(ZSTD_CDict *)0x0,in_stack_fffffffffffffeb8,
                     pledgedSrcSize);
  return sVar2;
}

Assistant:

size_t ZSTDMT_initCStream_advanced(ZSTDMT_CCtx* mtctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params,
                                   unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams = mtctx->params;  /* retrieve sticky params */
    DEBUGLOG(4, "ZSTDMT_initCStream_advanced (pledgedSrcSize=%u)", (U32)pledgedSrcSize);
    cctxParams.cParams = params.cParams;
    cctxParams.fParams = params.fParams;
    return ZSTDMT_initCStream_internal(mtctx, dict, dictSize, ZSTD_dct_auto, NULL,
                                       cctxParams, pledgedSrcSize);
}